

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddWalsh.c
# Opt level: O3

DdNode * Cudd_addWalsh(DdManager *dd,DdNode **x,DdNode **y,int n)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  DdNode *g;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  DdNode *local_40;
  
  iVar3 = n + -1;
  do {
    dd->reordered = 0;
    pDVar6 = dd->one;
    if (n == 0) {
      return pDVar6;
    }
    g = cuddUniqueConst(dd,-1.0);
    if (g == (DdNode *)0x0) {
      pDVar5 = (DdNode *)0x0;
    }
    else {
      uVar10 = (ulong)g & 0xfffffffffffffffe;
      *(int *)(uVar10 + 4) = *(int *)(uVar10 + 4) + 1;
      pDVar4 = Cudd_addIte(dd,y[iVar3],g,pDVar6);
      if (pDVar4 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar5 = Cudd_addIte(dd,x[iVar3],pDVar4,pDVar6);
        if (pDVar5 != (DdNode *)0x0) {
          uVar9 = (ulong)pDVar5 & 0xfffffffffffffffe;
          *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar4);
          if (n < 2) {
            *(int *)(uVar10 + 4) = *(int *)(uVar10 + 4) + -1;
          }
          else {
            pDVar4 = Cudd_addIte(dd,y[iVar3],pDVar6,g);
            if (pDVar4 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g);
              g = pDVar5;
              goto LAB_007c3c8f;
            }
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar6 = Cudd_addIte(dd,x[iVar3],pDVar4,g);
            if (pDVar6 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g);
              g = pDVar5;
              goto LAB_007c3c84;
            }
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,pDVar4);
            *(int *)(uVar10 + 4) = *(int *)(uVar10 + 4) + -1;
            g = pDVar6;
            lVar7 = (ulong)(n - 2) + 1;
            pDVar6 = pDVar5;
            do {
              pDVar4 = Cudd_addIte(dd,y[lVar7 + -1],g,pDVar6);
              if (pDVar4 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,pDVar6);
                goto LAB_007c3c8f;
              }
              piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar5 = Cudd_addIte(dd,x[lVar7 + -1],pDVar4,pDVar6);
              if (pDVar5 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,pDVar6);
                goto LAB_007c3c84;
              }
              uVar9 = (ulong)pDVar5 & 0xfffffffffffffffe;
              *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
              Cudd_RecursiveDeref(dd,pDVar4);
              local_40 = g;
              if (lVar7 != 1) {
                pDVar4 = Cudd_addIte(dd,y[lVar7 + -1],pDVar6,g);
                if (pDVar4 == (DdNode *)0x0) {
                  Cudd_RecursiveDeref(dd,pDVar6);
                  Cudd_RecursiveDeref(dd,g);
                  g = pDVar5;
                  goto LAB_007c3c8f;
                }
                piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                local_40 = Cudd_addIte(dd,x[lVar7 + -1],pDVar4,g);
                piVar1 = (int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                Cudd_RecursiveDeref(dd,pDVar4);
              }
              Cudd_RecursiveDeref(dd,pDVar6);
              Cudd_RecursiveDeref(dd,g);
              lVar8 = lVar7 + -1;
              bVar2 = 0 < lVar7;
              g = local_40;
              lVar7 = lVar8;
              pDVar6 = pDVar5;
            } while (lVar8 != 0 && bVar2);
          }
          *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + -1;
          goto LAB_007c3c9b;
        }
LAB_007c3c84:
        Cudd_RecursiveDeref(dd,g);
        g = pDVar4;
      }
LAB_007c3c8f:
      Cudd_RecursiveDeref(dd,g);
      pDVar5 = (DdNode *)0x0;
    }
LAB_007c3c9b:
    if (dd->reordered != 1) {
      return pDVar5;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_addWalsh(
  DdManager * dd,
  DdNode ** x,
  DdNode ** y,
  int  n)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = addWalshInt(dd, x, y, n);
    } while (dd->reordered == 1);
    return(res);

}